

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void PPRF_compute_all_keys(vector<GGMNode,_std::allocator<GGMNode>_> *node_list,int level)

{
  long lVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  double dVar4;
  __node_base_ptr p_Var5;
  mapped_type puVar6;
  mapped_type *ppuVar7;
  int __exponent;
  __node_base_ptr p_Var8;
  __hash_code __code;
  _Hash_node_base *offset;
  int iVar9;
  uint8_t derive_key [16];
  _Hash_node_base *local_78;
  pointer local_70;
  pointer local_68;
  double local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_68 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_70 = (node_list->super__Vector_base<GGMNode,_std::allocator<GGMNode>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_68 != local_70) {
    do {
      lVar1 = local_68->index;
      local_48 = *(undefined8 *)local_68->key;
      uStack_40 = *(undefined8 *)(local_68->key + 8);
      __exponent = level - local_68->level;
      dVar4 = ldexp(1.0,__exponent);
      if (0.0 < dVar4) {
        iVar9 = 0;
        do {
          local_58 = local_48;
          uStack_50 = uStack_40;
          offset = (_Hash_node_base *)(long)((int)(lVar1 << ((byte)__exponent & 0x3f)) + iVar9);
          GGMTree::derive_key_from_tree((uint8_t *)&local_58,(long)offset,__exponent,0);
          p_Var2 = keys._M_h._M_buckets[(ulong)offset % keys._M_h._M_bucket_count];
          p_Var5 = (__node_base_ptr)0x0;
          if ((p_Var2 != (__node_base_ptr)0x0) &&
             (p_Var5 = p_Var2, p_Var8 = p_Var2->_M_nxt, p_Var2->_M_nxt[1]._M_nxt != offset)) {
            while (p_Var3 = p_Var8->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
              p_Var5 = (__node_base_ptr)0x0;
              if (((ulong)p_Var3[1]._M_nxt % keys._M_h._M_bucket_count !=
                   (ulong)offset % keys._M_h._M_bucket_count) ||
                 (p_Var5 = p_Var8, p_Var8 = p_Var3, p_Var3[1]._M_nxt == offset)) goto LAB_00102884;
            }
            p_Var5 = (__node_base_ptr)0x0;
          }
LAB_00102884:
          if ((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) {
            puVar6 = (mapped_type)malloc(0x10);
            local_78 = offset;
            ppuVar7 = std::__detail::
                      _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&keys,(key_type *)&local_78);
            *ppuVar7 = puVar6;
            local_78 = offset;
            ppuVar7 = std::__detail::
                      _Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&keys,(key_type *)&local_78);
            puVar6 = *ppuVar7;
            *(undefined8 *)puVar6 = local_58;
            *(undefined8 *)(puVar6 + 8) = uStack_50;
          }
          iVar9 = iVar9 + 1;
          local_60 = (double)iVar9;
          dVar4 = ldexp(1.0,__exponent);
        } while (local_60 < dVar4);
      }
      local_68 = local_68 + 1;
    } while (local_68 != local_70);
  }
  return;
}

Assistant:

void PPRF_compute_all_keys(const vector<GGMNode>& node_list, int level) {
    for(GGMNode node : node_list) {
        for (int i = 0; i < pow(2, level - node.level); ++i) {
            int offset = ((node.index) << (level - node.level)) + i;
            uint8_t derive_key[AES_BLOCK_SIZE];
            memcpy(derive_key, node.key, AES_BLOCK_SIZE);
            GGMTree::derive_key_from_tree(derive_key,  offset, level - node.level, 0);
            if(keys.find(offset) == keys.end()) {
                keys[offset] = (uint8_t*) malloc(AES_BLOCK_SIZE);
                memcpy(keys[offset], derive_key, AES_BLOCK_SIZE);
//                for (int j = 0 ; j <16; ++j){
//                    printf ( "%02x ",keys[offset][j]);
//                }
//                cout << endl;
            }
        }
    }
}